

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O3

char * copystring(char *s)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    __dest = operator_new__(sVar1 + 1);
    pcVar2 = (char *)memcpy(__dest,s,sVar1 + 1);
    return pcVar2;
  }
  pcVar2 = (char *)operator_new__(1);
  *pcVar2 = '\0';
  return pcVar2;
}

Assistant:

char *copystring (const char *s)
{
	char *b;
	if (s)
	{
		size_t len = strlen (s) + 1;
		b = new char[len];
		memcpy (b, s, len);
	}
	else
	{
		b = new char[1];
		b[0] = '\0';
	}
	return b;
}